

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Scope::Scope(Scope *this,Parser *parser,bool topLevel)

{
  TokenType TVar1;
  Element *this_00;
  TokenPtr token;
  allocator<char> local_141;
  string local_140;
  int local_11c;
  _Base_ptr local_118;
  Element *local_110;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>
  local_108;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  string *str;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  TokenPtr local_68;
  TokenPtr n;
  string local_58;
  TokenPtr local_28;
  TokenPtr t;
  Parser *pPStack_18;
  bool topLevel_local;
  Parser *parser_local;
  Scope *this_local;
  
  t._7_1_ = topLevel;
  pPStack_18 = parser;
  parser_local = (Parser *)this;
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  ::multimap(&this->elements);
  if ((t._7_1_ & 1) == 0) {
    local_28 = Parser::CurrentToken(pPStack_18);
    TVar1 = Token::Type(local_28);
    if (TVar1 != TokenType_OPEN_BRACKET) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"expected open bracket",(allocator<char> *)((long)&n + 7));
      anon_unknown.dwarf_cdd617::ParseError(&local_58,local_28);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator((allocator<char> *)((long)&n + 7));
    }
  }
  local_68 = Parser::AdvanceToNextToken(pPStack_18);
  if (local_68 == (TokenPtr)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"unexpected end of file",&local_89);
    anon_unknown.dwarf_cdd617::ParseError(&local_88,(Element *)0x0);
  }
  do {
    TVar1 = Token::Type(local_68);
    if (TVar1 == TokenType_CLOSE_BRACKET) {
      return;
    }
    TVar1 = Token::Type(local_68);
    if (TVar1 != TokenType_KEY) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"unexpected token, expected TOK_KEY",
                 (allocator<char> *)((long)&str + 7));
      anon_unknown.dwarf_cdd617::ParseError(&local_b0,local_68);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&str + 7));
    }
    Token::StringContents_abi_cxx11_(&local_e0,local_68);
    local_c0 = &local_e0;
    this_00 = (Element *)operator_new(0x28);
    Element::Element(this_00,local_68,pPStack_18);
    local_110 = this_00;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>
    ::pair<Assimp::FBX::Element_*,_true>(&local_108,&local_e0,&local_110);
    local_118 = (_Base_ptr)
                std::
                multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
                ::insert(&this->elements,&local_108);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>
    ::~pair(&local_108);
    local_68 = Parser::CurrentToken(pPStack_18);
    if (local_68 == (TokenPtr)0x0) {
      if ((t._7_1_ & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_140,"unexpected end of file",&local_141);
        token = Parser::LastToken(pPStack_18);
        anon_unknown.dwarf_cdd617::ParseError(&local_140,token);
        std::__cxx11::string::~string((string *)&local_140);
        std::allocator<char>::~allocator(&local_141);
        goto LAB_0099ba8e;
      }
      local_11c = 1;
    }
    else {
LAB_0099ba8e:
      local_11c = 0;
    }
    std::__cxx11::string::~string((string *)&local_e0);
    if (local_11c != 0) {
      return;
    }
  } while( true );
}

Assistant:

Scope::Scope(Parser& parser,bool topLevel)
{
    if(!topLevel) {
        TokenPtr t = parser.CurrentToken();
        if (t->Type() != TokenType_OPEN_BRACKET) {
            ParseError("expected open bracket",t);
        }
    }

    TokenPtr n = parser.AdvanceToNextToken();
    if(n == NULL) {
        ParseError("unexpected end of file");
    }

    // note: empty scopes are allowed
    while(n->Type() != TokenType_CLOSE_BRACKET) {
        if (n->Type() != TokenType_KEY) {
            ParseError("unexpected token, expected TOK_KEY",n);
        }

        const std::string& str = n->StringContents();
        elements.insert(ElementMap::value_type(str,new_Element(*n,parser)));

        // Element() should stop at the next Key token (or right after a Close token)
        n = parser.CurrentToken();
        if(n == NULL) {
            if (topLevel) {
                return;
            }
            ParseError("unexpected end of file",parser.LastToken());
        }
    }
}